

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_cl(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  
  if (rd == 0) {
switchD_0087fa4c_caseD_70000022:
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_ctx->cpu_gpr[(uint)rd];
  gen_load_gpr(tcg_ctx,t,rs);
  switch(opc) {
  case 0x10:
    goto switchD_0087fa4c_caseD_70000020;
  case 0x11:
  case 0x13:
    break;
  case 0x12:
    goto switchD_0087fa4c_caseD_70000024;
  default:
    switch(opc) {
    case 0x70000020:
      goto switchD_0087fa4c_caseD_70000020;
    case 0x70000021:
    case 0x70000025:
      break;
    default:
      goto switchD_0087fa4c_caseD_70000022;
    case 0x70000024:
      goto switchD_0087fa4c_caseD_70000024;
    }
  }
  tcg_gen_not_i64_mips64el(tcg_ctx,t,t);
  if (opc - 0x12 < 2) {
switchD_0087fa4c_caseD_70000024:
    tcg_gen_clzi_i64_mips64el(tcg_ctx,t,t,0x40);
    return;
  }
  if (1 < opc + 0x8fffffe0) {
    if (opc + 0x8fffffdc < 2) goto switchD_0087fa4c_caseD_70000024;
    if (opc != 0x11) {
      return;
    }
  }
switchD_0087fa4c_caseD_70000020:
  tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
  tcg_gen_clzi_i64_mips64el(tcg_ctx,t,t,0x40);
  tcg_gen_subi_i64_mips64el(tcg_ctx,t,t,0x20);
  return;
}

Assistant:

static void gen_cl(DisasContext *ctx, uint32_t opc,
                   int rd, int rs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_ctx->cpu_gpr[rd];
    gen_load_gpr(tcg_ctx, t0, rs);

    switch (opc) {
    case OPC_CLO:
    case R6_OPC_CLO:
#if defined(TARGET_MIPS64)
    case OPC_DCLO:
    case R6_OPC_DCLO:
#endif
        tcg_gen_not_tl(tcg_ctx, t0, t0);
        break;
    }

    switch (opc) {
    case OPC_CLO:
    case R6_OPC_CLO:
    case OPC_CLZ:
    case R6_OPC_CLZ:
        tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
        tcg_gen_clzi_tl(tcg_ctx, t0, t0, TARGET_LONG_BITS);
        tcg_gen_subi_tl(tcg_ctx, t0, t0, TARGET_LONG_BITS - 32);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DCLO:
    case R6_OPC_DCLO:
    case OPC_DCLZ:
    case R6_OPC_DCLZ:
        tcg_gen_clzi_i64(tcg_ctx, t0, t0, 64);
        break;
#endif
    }
}